

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kerning.cpp
# Opt level: O2

void dpfb::readValuesForSize
               (Stream *stream,uint32_t subTablePos,LookupContext *ctx,int *values,int valueFormat)

{
  int iVar1;
  byte bVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  undefined4 extraout_var;
  StreamError *this;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int i_1;
  int i;
  long lVar11;
  uint16_t deviceOffsets [4];
  string local_50;
  
  for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
    if (((uint)valueFormat >> ((uint)lVar11 & 0x1f) & 1) == 0) {
      iVar5 = 0;
    }
    else {
      uVar3 = streams::Stream::readU16Be(stream);
      lVar7 = lroundf((float)(int)(short)uVar3 * ctx->scale);
      iVar5 = (int)lVar7;
    }
    values[lVar11] = iVar5;
  }
  for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
    bVar2 = (byte)lVar11 & 0x1f;
    if (((uint)valueFormat >> bVar2 & 0x10) == 0) {
      uVar3 = (uint16_t)(0 >> bVar2);
    }
    else {
      uVar3 = streams::Stream::readU16Be(stream);
    }
    deviceOffsets[lVar11] = uVar3;
  }
  iVar5 = (*stream->_vptr_Stream[8])();
  lVar11 = 0;
  do {
    if (lVar11 == 4) {
      (*stream->_vptr_Stream[7])(stream,CONCAT44(extraout_var,iVar5),0);
      return;
    }
    if (deviceOffsets[lVar11] != 0) {
      (*stream->_vptr_Stream[7])(stream,(ulong)(deviceOffsets[lVar11] + subTablePos),0);
      iVar1 = ctx->pxSize;
      uVar3 = streams::Stream::readU16Be(stream);
      uVar4 = streams::Stream::readU16Be(stream);
      uVar9 = (uint)uVar3;
      if (uVar4 < uVar3) {
        this = (StreamError *)__cxa_allocate_exception(0x10);
        str::format_abi_cxx11_
                  (&local_50,"Device table start size (%u) > end size (%u)",(ulong)uVar9,
                   (ulong)uVar4);
        streams::StreamError::runtime_error(this,&local_50);
        __cxa_throw(this,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar6 = 0;
      if (iVar1 <= (int)(uint)uVar4 && (int)uVar9 <= iVar1) {
        uVar3 = streams::Stream::readU16Be(stream);
        bVar2 = (byte)uVar3;
        iVar6 = 0;
        if (0xfffc < (ushort)(uVar3 - 4)) {
          uVar10 = 0x10 >> (bVar2 & 0x1f);
          iVar6 = (int)(iVar1 - uVar9) / (int)uVar10;
          (*stream->_vptr_Stream[7])(stream,(long)iVar6 * 2,1);
          uVar3 = streams::Stream::readU16Be(stream);
          uVar8 = 0xff >> ((char)(-1 << (bVar2 & 0x1f)) + 8U & 0x1f);
          uVar9 = uVar3 >> ((byte)(~(iVar1 - uVar9) + (iVar6 + 1) * uVar10 << (bVar2 & 0x1f)) & 0x1f
                           ) & uVar8;
          uVar8 = uVar8 + 1;
          if (uVar9 < uVar8 >> 1) {
            uVar8 = 0;
          }
          iVar6 = uVar9 - uVar8;
        }
      }
      values[lVar11] = values[lVar11] + iVar6;
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

static void readValuesForSize(
    Stream& stream,
    std::uint32_t subTablePos,
    const LookupContext& ctx,
    int values[numValues],
    int valueFormat)
{
    for (int i = 0; i < numValues; ++i)
        if (valueFormat & (1 << i))
            values[i] = std::lround(stream.readS16Be() * ctx.scale);
        else
            values[i] = 0;

    std::uint16_t deviceOffsets[numValues];
    for (int i = 0; i < numValues; ++i)
        if (valueFormat & (1 << (i + numValues)))
            deviceOffsets[i] = stream.readU16Be();
        else
            deviceOffsets[i] = 0;

    const auto prevPos = stream.getPosition();
    for (int i = 0; i < numValues; ++i) {
        const auto deviceOffset = deviceOffsets[i];
        if (deviceOffset == 0)
            continue;

        stream.seek(subTablePos + deviceOffset, SeekOrigin::set);
        values[i] += readDeviceAdjsutment(stream, ctx.pxSize);
    }
    stream.seek(prevPos, SeekOrigin::set);
}